

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreePrevious(BtCursor *pCur,int *pRes)

{
  MemPage *pMVar1;
  u32 newPgno;
  int iVar2;
  int local_38;
  int idx;
  MemPage *pPage;
  int rc;
  int *pRes_local;
  BtCursor *pCur_local;
  
  if (pCur->eState < 2) {
    local_38 = 0;
  }
  else {
    local_38 = btreeRestoreCursorPosition(pCur);
  }
  if (local_38 == 0) {
    pCur->atLast = '\0';
    if (pCur->eState == '\0') {
      *pRes = 1;
      pCur_local._4_4_ = 0;
    }
    else if (pCur->skipNext < 0) {
      pCur->skipNext = 0;
      *pRes = 0;
      pCur_local._4_4_ = 0;
    }
    else {
      pCur->skipNext = 0;
      pMVar1 = pCur->apPage[pCur->iPage];
      if (pMVar1->leaf == '\0') {
        newPgno = sqlite3Get4byte(pMVar1->aData +
                                  (int)(uint)(pMVar1->maskPage &
                                             CONCAT11(pMVar1->aCellIdx
                                                      [(int)((uint)pCur->aiIdx[pCur->iPage] << 1)],
                                                      pMVar1->aCellIdx
                                                      [(long)(int)((uint)pCur->aiIdx[pCur->iPage] <<
                                                                  1) + 1])));
        iVar2 = moveToChild(pCur,newPgno);
        if (iVar2 != 0) {
          return iVar2;
        }
        pPage._4_4_ = moveToRightmost(pCur);
      }
      else {
        while (pCur->aiIdx[pCur->iPage] == 0) {
          if (pCur->iPage == 0) {
            pCur->eState = '\0';
            *pRes = 1;
            return 0;
          }
          moveToParent(pCur);
        }
        (pCur->info).nSize = 0;
        pCur->validNKey = '\0';
        pCur->aiIdx[pCur->iPage] = pCur->aiIdx[pCur->iPage] - 1;
        if ((pCur->apPage[pCur->iPage]->intKey == '\0') || (pCur->apPage[pCur->iPage]->leaf != '\0')
           ) {
          pPage._4_4_ = 0;
        }
        else {
          pPage._4_4_ = sqlite3BtreePrevious(pCur,pRes);
        }
      }
      *pRes = 0;
      pCur_local._4_4_ = pPage._4_4_;
    }
  }
  else {
    pCur_local._4_4_ = local_38;
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int *pRes){
  int rc;
  MemPage *pPage;

  assert( cursorHoldsMutex(pCur) );
  rc = restoreCursorPosition(pCur);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pCur->atLast = 0;
  if( CURSOR_INVALID==pCur->eState ){
    *pRes = 1;
    return SQLITE_OK;
  }
  if( pCur->skipNext<0 ){
    pCur->skipNext = 0;
    *pRes = 0;
    return SQLITE_OK;
  }
  pCur->skipNext = 0;

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->isInit );
  if( !pPage->leaf ){
    int idx = pCur->aiIdx[pCur->iPage];
    rc = moveToChild(pCur, get4byte(findCell(pPage, idx)));
    if( rc ){
      return rc;
    }
    rc = moveToRightmost(pCur);
  }else{
    while( pCur->aiIdx[pCur->iPage]==0 ){
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        *pRes = 1;
        return SQLITE_OK;
      }
      moveToParent(pCur);
    }
    pCur->info.nSize = 0;
    pCur->validNKey = 0;

    pCur->aiIdx[pCur->iPage]--;
    pPage = pCur->apPage[pCur->iPage];
    if( pPage->intKey && !pPage->leaf ){
      rc = sqlite3BtreePrevious(pCur, pRes);
    }else{
      rc = SQLITE_OK;
    }
  }
  *pRes = 0;
  return rc;
}